

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_DefaultStringAgain_Test::~TApp_DefaultStringAgain_Test(TApp_DefaultStringAgain_Test *this)

{
  TApp_DefaultStringAgain_Test *this_local;
  
  ~TApp_DefaultStringAgain_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, DefaultStringAgain) {
    std::string str = "previous";
    app.add_option("-s,--string", str);
    run();
    EXPECT_EQ((size_t)0, app.count("-s"));
    EXPECT_EQ((size_t)0, app.count("--string"));
    EXPECT_EQ(str, "previous");
}